

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O0

void deqp::gles31::Functional::anon_unknown_0::generateProgramInputLocationBlockContents
               (Context *context,SharedPtr *parentStructure,TestCaseGroup *targetGroup,
               deUint32 presentShadersMask)

{
  NodeType NVar1;
  Node *pNVar2;
  StorageQualifier *pSVar3;
  Variable *pVVar4;
  ResourceTestCase *pRVar5;
  LayoutQualifier *pLVar6;
  ArrayElement *pAVar7;
  ProgramResourceQueryTestTarget local_440;
  undefined1 local_438 [8];
  SharedPtr variable_17;
  SharedPtr arrayElem_7;
  undefined1 local_400 [8];
  SharedPtr layout_8;
  undefined1 local_3e8 [8];
  SharedPtr variable_16;
  SharedPtr arrayElem_6;
  undefined1 local_3c0 [8];
  SharedPtr variable_15;
  SharedPtr structMbr_3;
  undefined1 local_388 [8];
  SharedPtr layout_7;
  undefined1 local_370 [8];
  SharedPtr variable_14;
  SharedPtr structMbr_2;
  undefined1 local_348 [8];
  SharedPtr variable_13;
  undefined1 local_320 [8];
  SharedPtr layout_6;
  undefined1 local_308 [8];
  SharedPtr variable_12;
  undefined1 local_2f0 [8];
  SharedPtr variable_11;
  SharedPtr arrayElem_5;
  undefined1 local_2b8 [8];
  SharedPtr layout_5;
  undefined1 local_2a0 [8];
  SharedPtr variable_10;
  SharedPtr arrayElem_4;
  SharedPtr patchInput;
  undefined1 local_268 [8];
  SharedPtr variable_9;
  SharedPtr arrayElem_3;
  undefined1 local_230 [8];
  SharedPtr layout_4;
  undefined1 local_218 [8];
  SharedPtr variable_8;
  SharedPtr arrayElem_2;
  undefined1 local_1f0 [8];
  SharedPtr variable_7;
  SharedPtr arrayElem_1;
  undefined1 local_1b8 [8];
  SharedPtr layout_3;
  undefined1 local_1a0 [8];
  SharedPtr variable_6;
  SharedPtr arrayElem;
  undefined1 local_178 [8];
  SharedPtr variable_5;
  SharedPtr structMbr_1;
  undefined1 local_140 [8];
  SharedPtr layout_2;
  undefined1 local_128 [8];
  SharedPtr variable_4;
  SharedPtr structMbr;
  undefined1 local_100 [8];
  SharedPtr variable_3;
  undefined1 local_d8 [8];
  SharedPtr layout_1;
  undefined1 local_c0 [8];
  SharedPtr variable_2;
  undefined1 local_a8 [8];
  SharedPtr variable_1;
  undefined1 local_80 [8];
  SharedPtr layout;
  undefined1 local_68 [8];
  SharedPtr variable;
  ShaderType firstStage;
  undefined1 local_38 [8];
  SharedPtr input;
  bool inDefaultBlock;
  deUint32 presentShadersMask_local;
  TestCaseGroup *targetGroup_local;
  SharedPtr *parentStructure_local;
  Context *context_local;
  
  input.m_state._4_4_ = presentShadersMask;
  pNVar2 = de::
           SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
           ::operator->(parentStructure);
  NVar1 = ResourceDefinition::Node::getType(pNVar2);
  input.m_state._3_1_ = NVar1 == TYPE_DEFAULT_BLOCK;
  if ((bool)input.m_state._3_1_) {
    pSVar3 = (StorageQualifier *)operator_new(0x28);
    ResourceDefinition::StorageQualifier::StorageQualifier(pSVar3,parentStructure,STORAGE_IN);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               *)local_38,(Node *)pSVar3);
  }
  else {
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               *)local_38,parentStructure);
  }
  variable.m_state._0_4_ = getShaderMaskFirstStage(input.m_state._4_4_);
  if ((ShaderType)variable.m_state == SHADERTYPE_VERTEX) {
    pVVar4 = (Variable *)operator_new(0x28);
    ResourceDefinition::Variable::Variable(pVVar4,(SharedPtr *)local_38,TYPE_FLOAT_VEC4);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               *)local_68,(Node *)pVVar4);
    pRVar5 = (ResourceTestCase *)operator_new(0xb0);
    ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
              ((ProgramResourceQueryTestTarget *)&layout.m_state,PROGRAMINTERFACE_PROGRAM_INPUT,0x20
              );
    ResourceTestCase::ResourceTestCase
              (pRVar5,context,(SharedPtr *)local_68,
               (ProgramResourceQueryTestTarget *)&layout.m_state,"var");
    tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pRVar5);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                *)local_68);
    pLVar6 = (LayoutQualifier *)operator_new(0x38);
    glu::Layout::Layout((Layout *)((long)&variable_1.m_state + 4),2,-1,-1,FORMATLAYOUT_LAST,
                        MATRIXORDER_LAST);
    ResourceDefinition::LayoutQualifier::LayoutQualifier
              (pLVar6,(SharedPtr *)local_38,(Layout *)((long)&variable_1.m_state + 4));
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               *)local_80,(Node *)pLVar6);
    pVVar4 = (Variable *)operator_new(0x28);
    ResourceDefinition::Variable::Variable(pVVar4,(SharedPtr *)local_80,TYPE_FLOAT_VEC4);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               *)local_a8,(Node *)pVVar4);
    pRVar5 = (ResourceTestCase *)operator_new(0xb0);
    ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
              ((ProgramResourceQueryTestTarget *)&variable_2.m_state,PROGRAMINTERFACE_PROGRAM_INPUT,
               0x20);
    ResourceTestCase::ResourceTestCase
              (pRVar5,context,(SharedPtr *)local_a8,
               (ProgramResourceQueryTestTarget *)&variable_2.m_state,"var_explicit_location");
    tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pRVar5);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                *)local_a8);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                *)local_80);
  }
  else if (((ShaderType)variable.m_state == SHADERTYPE_FRAGMENT) || ((input.m_state._3_1_ & 1) == 0)
          ) {
    pVVar4 = (Variable *)operator_new(0x28);
    ResourceDefinition::Variable::Variable(pVVar4,(SharedPtr *)local_38,TYPE_FLOAT_VEC4);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               *)local_c0,(Node *)pVVar4);
    pRVar5 = (ResourceTestCase *)operator_new(0xb0);
    ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
              ((ProgramResourceQueryTestTarget *)&layout_1.m_state,PROGRAMINTERFACE_PROGRAM_INPUT,
               0x20);
    ResourceTestCase::ResourceTestCase
              (pRVar5,context,(SharedPtr *)local_c0,
               (ProgramResourceQueryTestTarget *)&layout_1.m_state,"var");
    tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pRVar5);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                *)local_c0);
    pLVar6 = (LayoutQualifier *)operator_new(0x38);
    glu::Layout::Layout((Layout *)((long)&variable_3.m_state + 4),2,-1,-1,FORMATLAYOUT_LAST,
                        MATRIXORDER_LAST);
    ResourceDefinition::LayoutQualifier::LayoutQualifier
              (pLVar6,(SharedPtr *)local_38,(Layout *)((long)&variable_3.m_state + 4));
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               *)local_d8,(Node *)pLVar6);
    pVVar4 = (Variable *)operator_new(0x28);
    ResourceDefinition::Variable::Variable(pVVar4,(SharedPtr *)local_d8,TYPE_FLOAT_VEC4);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               *)local_100,(Node *)pVVar4);
    pRVar5 = (ResourceTestCase *)operator_new(0xb0);
    ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
              ((ProgramResourceQueryTestTarget *)&structMbr.m_state,PROGRAMINTERFACE_PROGRAM_INPUT,
               0x20);
    ResourceTestCase::ResourceTestCase
              (pRVar5,context,(SharedPtr *)local_100,
               (ProgramResourceQueryTestTarget *)&structMbr.m_state,"var_explicit_location");
    tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pRVar5);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                *)local_100);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                *)local_d8);
    pNVar2 = (Node *)operator_new(0x20);
    ResourceDefinition::StructMember::StructMember((StructMember *)pNVar2,(SharedPtr *)local_38);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               *)&variable_4.m_state,pNVar2);
    pVVar4 = (Variable *)operator_new(0x28);
    ResourceDefinition::Variable::Variable(pVVar4,(SharedPtr *)&variable_4.m_state,TYPE_FLOAT_VEC4);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               *)local_128,(Node *)pVVar4);
    pRVar5 = (ResourceTestCase *)operator_new(0xb0);
    ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
              ((ProgramResourceQueryTestTarget *)&layout_2.m_state,PROGRAMINTERFACE_PROGRAM_INPUT,
               0x20);
    ResourceTestCase::ResourceTestCase
              (pRVar5,context,(SharedPtr *)local_128,
               (ProgramResourceQueryTestTarget *)&layout_2.m_state,"var_struct");
    tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pRVar5);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                *)local_128);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                *)&variable_4.m_state);
    pLVar6 = (LayoutQualifier *)operator_new(0x38);
    glu::Layout::Layout((Layout *)((long)&structMbr_1.m_state + 4),2,-1,-1,FORMATLAYOUT_LAST,
                        MATRIXORDER_LAST);
    ResourceDefinition::LayoutQualifier::LayoutQualifier
              (pLVar6,(SharedPtr *)local_38,(Layout *)((long)&structMbr_1.m_state + 4));
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               *)local_140,(Node *)pLVar6);
    pNVar2 = (Node *)operator_new(0x20);
    ResourceDefinition::StructMember::StructMember((StructMember *)pNVar2,(SharedPtr *)local_140);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               *)&variable_5.m_state,pNVar2);
    pVVar4 = (Variable *)operator_new(0x28);
    ResourceDefinition::Variable::Variable(pVVar4,(SharedPtr *)&variable_5.m_state,TYPE_FLOAT_VEC4);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               *)local_178,(Node *)pVVar4);
    pRVar5 = (ResourceTestCase *)operator_new(0xb0);
    ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
              ((ProgramResourceQueryTestTarget *)&arrayElem.m_state,PROGRAMINTERFACE_PROGRAM_INPUT,
               0x20);
    ResourceTestCase::ResourceTestCase
              (pRVar5,context,(SharedPtr *)local_178,
               (ProgramResourceQueryTestTarget *)&arrayElem.m_state,"var_struct_explicit_location");
    tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pRVar5);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                *)local_178);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                *)&variable_5.m_state);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                *)local_140);
    pAVar7 = (ArrayElement *)operator_new(0x28);
    ResourceDefinition::ArrayElement::ArrayElement(pAVar7,(SharedPtr *)local_38,-1);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               *)&variable_6.m_state,(Node *)pAVar7);
    pVVar4 = (Variable *)operator_new(0x28);
    ResourceDefinition::Variable::Variable(pVVar4,(SharedPtr *)&variable_6.m_state,TYPE_FLOAT_VEC4);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               *)local_1a0,(Node *)pVVar4);
    pRVar5 = (ResourceTestCase *)operator_new(0xb0);
    ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
              ((ProgramResourceQueryTestTarget *)&layout_3.m_state,PROGRAMINTERFACE_PROGRAM_INPUT,
               0x20);
    ResourceTestCase::ResourceTestCase
              (pRVar5,context,(SharedPtr *)local_1a0,
               (ProgramResourceQueryTestTarget *)&layout_3.m_state,"var_array");
    tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pRVar5);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                *)local_1a0);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                *)&variable_6.m_state);
    pLVar6 = (LayoutQualifier *)operator_new(0x38);
    glu::Layout::Layout((Layout *)((long)&arrayElem_1.m_state + 4),2,-1,-1,FORMATLAYOUT_LAST,
                        MATRIXORDER_LAST);
    ResourceDefinition::LayoutQualifier::LayoutQualifier
              (pLVar6,(SharedPtr *)local_38,(Layout *)((long)&arrayElem_1.m_state + 4));
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               *)local_1b8,(Node *)pLVar6);
    pAVar7 = (ArrayElement *)operator_new(0x28);
    ResourceDefinition::ArrayElement::ArrayElement(pAVar7,(SharedPtr *)local_1b8,-1);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               *)&variable_7.m_state,(Node *)pAVar7);
    pVVar4 = (Variable *)operator_new(0x28);
    ResourceDefinition::Variable::Variable(pVVar4,(SharedPtr *)&variable_7.m_state,TYPE_FLOAT_VEC4);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               *)local_1f0,(Node *)pVVar4);
    pRVar5 = (ResourceTestCase *)operator_new(0xb0);
    ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
              ((ProgramResourceQueryTestTarget *)&arrayElem_2.m_state,PROGRAMINTERFACE_PROGRAM_INPUT
               ,0x20);
    ResourceTestCase::ResourceTestCase
              (pRVar5,context,(SharedPtr *)local_1f0,
               (ProgramResourceQueryTestTarget *)&arrayElem_2.m_state,"var_array_explicit_location")
    ;
    tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pRVar5);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                *)local_1f0);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                *)&variable_7.m_state);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                *)local_1b8);
  }
  else if (((ShaderType)variable.m_state == SHADERTYPE_TESSELLATION_CONTROL) ||
          ((ShaderType)variable.m_state == SHADERTYPE_GEOMETRY)) {
    pAVar7 = (ArrayElement *)operator_new(0x28);
    ResourceDefinition::ArrayElement::ArrayElement(pAVar7,(SharedPtr *)local_38,-2);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               *)&variable_8.m_state,(Node *)pAVar7);
    pVVar4 = (Variable *)operator_new(0x28);
    ResourceDefinition::Variable::Variable(pVVar4,(SharedPtr *)&variable_8.m_state,TYPE_FLOAT_VEC4);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               *)local_218,(Node *)pVVar4);
    pRVar5 = (ResourceTestCase *)operator_new(0xb0);
    ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
              ((ProgramResourceQueryTestTarget *)&layout_4.m_state,PROGRAMINTERFACE_PROGRAM_INPUT,
               0x20);
    ResourceTestCase::ResourceTestCase
              (pRVar5,context,(SharedPtr *)local_218,
               (ProgramResourceQueryTestTarget *)&layout_4.m_state,"var");
    tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pRVar5);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                *)local_218);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                *)&variable_8.m_state);
    pLVar6 = (LayoutQualifier *)operator_new(0x38);
    glu::Layout::Layout((Layout *)((long)&arrayElem_3.m_state + 4),2,-1,-1,FORMATLAYOUT_LAST,
                        MATRIXORDER_LAST);
    ResourceDefinition::LayoutQualifier::LayoutQualifier
              (pLVar6,(SharedPtr *)local_38,(Layout *)((long)&arrayElem_3.m_state + 4));
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               *)local_230,(Node *)pLVar6);
    pAVar7 = (ArrayElement *)operator_new(0x28);
    ResourceDefinition::ArrayElement::ArrayElement(pAVar7,(SharedPtr *)local_230,-2);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               *)&variable_9.m_state,(Node *)pAVar7);
    pVVar4 = (Variable *)operator_new(0x28);
    ResourceDefinition::Variable::Variable(pVVar4,(SharedPtr *)&variable_9.m_state,TYPE_FLOAT_VEC4);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               *)local_268,(Node *)pVVar4);
    pRVar5 = (ResourceTestCase *)operator_new(0xb0);
    ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
              ((ProgramResourceQueryTestTarget *)&patchInput.m_state,PROGRAMINTERFACE_PROGRAM_INPUT,
               0x20);
    ResourceTestCase::ResourceTestCase
              (pRVar5,context,(SharedPtr *)local_268,
               (ProgramResourceQueryTestTarget *)&patchInput.m_state,"var_explicit_location");
    tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pRVar5);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                *)local_268);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                *)&variable_9.m_state);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                *)local_230);
  }
  else if ((ShaderType)variable.m_state == SHADERTYPE_TESSELLATION_EVALUATION) {
    pSVar3 = (StorageQualifier *)operator_new(0x28);
    ResourceDefinition::StorageQualifier::StorageQualifier(pSVar3,parentStructure,STORAGE_PATCH_IN);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               *)&arrayElem_4.m_state,(Node *)pSVar3);
    pAVar7 = (ArrayElement *)operator_new(0x28);
    ResourceDefinition::ArrayElement::ArrayElement(pAVar7,(SharedPtr *)local_38,-2);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               *)&variable_10.m_state,(Node *)pAVar7);
    pVVar4 = (Variable *)operator_new(0x28);
    ResourceDefinition::Variable::Variable(pVVar4,(SharedPtr *)&variable_10.m_state,TYPE_FLOAT_VEC4)
    ;
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               *)local_2a0,(Node *)pVVar4);
    pRVar5 = (ResourceTestCase *)operator_new(0xb0);
    ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
              ((ProgramResourceQueryTestTarget *)&layout_5.m_state,PROGRAMINTERFACE_PROGRAM_INPUT,
               0x20);
    ResourceTestCase::ResourceTestCase
              (pRVar5,context,(SharedPtr *)local_2a0,
               (ProgramResourceQueryTestTarget *)&layout_5.m_state,"var");
    tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pRVar5);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                *)local_2a0);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                *)&variable_10.m_state);
    pLVar6 = (LayoutQualifier *)operator_new(0x38);
    glu::Layout::Layout((Layout *)((long)&arrayElem_5.m_state + 4),2,-1,-1,FORMATLAYOUT_LAST,
                        MATRIXORDER_LAST);
    ResourceDefinition::LayoutQualifier::LayoutQualifier
              (pLVar6,(SharedPtr *)local_38,(Layout *)((long)&arrayElem_5.m_state + 4));
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               *)local_2b8,(Node *)pLVar6);
    pAVar7 = (ArrayElement *)operator_new(0x28);
    ResourceDefinition::ArrayElement::ArrayElement(pAVar7,(SharedPtr *)local_2b8,-2);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               *)&variable_11.m_state,(Node *)pAVar7);
    pVVar4 = (Variable *)operator_new(0x28);
    ResourceDefinition::Variable::Variable(pVVar4,(SharedPtr *)&variable_11.m_state,TYPE_FLOAT_VEC4)
    ;
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               *)local_2f0,(Node *)pVVar4);
    pRVar5 = (ResourceTestCase *)operator_new(0xb0);
    ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
              ((ProgramResourceQueryTestTarget *)&variable_12.m_state,PROGRAMINTERFACE_PROGRAM_INPUT
               ,0x20);
    ResourceTestCase::ResourceTestCase
              (pRVar5,context,(SharedPtr *)local_2f0,
               (ProgramResourceQueryTestTarget *)&variable_12.m_state,"var_explicit_location");
    tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pRVar5);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                *)local_2f0);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                *)&variable_11.m_state);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                *)local_2b8);
    pVVar4 = (Variable *)operator_new(0x28);
    ResourceDefinition::Variable::Variable(pVVar4,(SharedPtr *)&arrayElem_4.m_state,TYPE_FLOAT_VEC4)
    ;
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               *)local_308,(Node *)pVVar4);
    pRVar5 = (ResourceTestCase *)operator_new(0xb0);
    ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
              ((ProgramResourceQueryTestTarget *)&layout_6.m_state,PROGRAMINTERFACE_PROGRAM_INPUT,
               0x20);
    ResourceTestCase::ResourceTestCase
              (pRVar5,context,(SharedPtr *)local_308,
               (ProgramResourceQueryTestTarget *)&layout_6.m_state,"patch_var");
    tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pRVar5);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                *)local_308);
    pLVar6 = (LayoutQualifier *)operator_new(0x38);
    glu::Layout::Layout((Layout *)((long)&variable_13.m_state + 4),2,-1,-1,FORMATLAYOUT_LAST,
                        MATRIXORDER_LAST);
    ResourceDefinition::LayoutQualifier::LayoutQualifier
              (pLVar6,(SharedPtr *)&arrayElem_4.m_state,(Layout *)((long)&variable_13.m_state + 4));
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               *)local_320,(Node *)pLVar6);
    pVVar4 = (Variable *)operator_new(0x28);
    ResourceDefinition::Variable::Variable(pVVar4,(SharedPtr *)local_320,TYPE_FLOAT_VEC4);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               *)local_348,(Node *)pVVar4);
    pRVar5 = (ResourceTestCase *)operator_new(0xb0);
    ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
              ((ProgramResourceQueryTestTarget *)&structMbr_2.m_state,PROGRAMINTERFACE_PROGRAM_INPUT
               ,0x20);
    ResourceTestCase::ResourceTestCase
              (pRVar5,context,(SharedPtr *)local_348,
               (ProgramResourceQueryTestTarget *)&structMbr_2.m_state,"patch_var_explicit_location")
    ;
    tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pRVar5);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                *)local_348);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                *)local_320);
    pNVar2 = (Node *)operator_new(0x20);
    ResourceDefinition::StructMember::StructMember
              ((StructMember *)pNVar2,(SharedPtr *)&arrayElem_4.m_state);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               *)&variable_14.m_state,pNVar2);
    pVVar4 = (Variable *)operator_new(0x28);
    ResourceDefinition::Variable::Variable(pVVar4,(SharedPtr *)&variable_14.m_state,TYPE_FLOAT_VEC4)
    ;
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               *)local_370,(Node *)pVVar4);
    pRVar5 = (ResourceTestCase *)operator_new(0xb0);
    ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
              ((ProgramResourceQueryTestTarget *)&layout_7.m_state,PROGRAMINTERFACE_PROGRAM_INPUT,
               0x20);
    ResourceTestCase::ResourceTestCase
              (pRVar5,context,(SharedPtr *)local_370,
               (ProgramResourceQueryTestTarget *)&layout_7.m_state,"patch_var_struct");
    tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pRVar5);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                *)local_370);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                *)&variable_14.m_state);
    pLVar6 = (LayoutQualifier *)operator_new(0x38);
    glu::Layout::Layout((Layout *)((long)&structMbr_3.m_state + 4),2,-1,-1,FORMATLAYOUT_LAST,
                        MATRIXORDER_LAST);
    ResourceDefinition::LayoutQualifier::LayoutQualifier
              (pLVar6,(SharedPtr *)&arrayElem_4.m_state,(Layout *)((long)&structMbr_3.m_state + 4));
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               *)local_388,(Node *)pLVar6);
    pNVar2 = (Node *)operator_new(0x20);
    ResourceDefinition::StructMember::StructMember((StructMember *)pNVar2,(SharedPtr *)local_388);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               *)&variable_15.m_state,pNVar2);
    pVVar4 = (Variable *)operator_new(0x28);
    ResourceDefinition::Variable::Variable(pVVar4,(SharedPtr *)&variable_15.m_state,TYPE_FLOAT_VEC4)
    ;
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               *)local_3c0,(Node *)pVVar4);
    pRVar5 = (ResourceTestCase *)operator_new(0xb0);
    ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
              ((ProgramResourceQueryTestTarget *)&arrayElem_6.m_state,PROGRAMINTERFACE_PROGRAM_INPUT
               ,0x20);
    ResourceTestCase::ResourceTestCase
              (pRVar5,context,(SharedPtr *)local_3c0,
               (ProgramResourceQueryTestTarget *)&arrayElem_6.m_state,
               "patch_var_struct_explicit_location");
    tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pRVar5);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                *)local_3c0);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                *)&variable_15.m_state);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                *)local_388);
    pAVar7 = (ArrayElement *)operator_new(0x28);
    ResourceDefinition::ArrayElement::ArrayElement(pAVar7,(SharedPtr *)&arrayElem_4.m_state,-1);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               *)&variable_16.m_state,(Node *)pAVar7);
    pVVar4 = (Variable *)operator_new(0x28);
    ResourceDefinition::Variable::Variable(pVVar4,(SharedPtr *)&variable_16.m_state,TYPE_FLOAT_VEC4)
    ;
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               *)local_3e8,(Node *)pVVar4);
    pRVar5 = (ResourceTestCase *)operator_new(0xb0);
    ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
              ((ProgramResourceQueryTestTarget *)&layout_8.m_state,PROGRAMINTERFACE_PROGRAM_INPUT,
               0x20);
    ResourceTestCase::ResourceTestCase
              (pRVar5,context,(SharedPtr *)local_3e8,
               (ProgramResourceQueryTestTarget *)&layout_8.m_state,"patch_var_array");
    tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pRVar5);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                *)local_3e8);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                *)&variable_16.m_state);
    pLVar6 = (LayoutQualifier *)operator_new(0x38);
    glu::Layout::Layout((Layout *)((long)&arrayElem_7.m_state + 4),2,-1,-1,FORMATLAYOUT_LAST,
                        MATRIXORDER_LAST);
    ResourceDefinition::LayoutQualifier::LayoutQualifier
              (pLVar6,(SharedPtr *)&arrayElem_4.m_state,(Layout *)((long)&arrayElem_7.m_state + 4));
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               *)local_400,(Node *)pLVar6);
    pAVar7 = (ArrayElement *)operator_new(0x28);
    ResourceDefinition::ArrayElement::ArrayElement(pAVar7,(SharedPtr *)local_400,-1);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               *)&variable_17.m_state,(Node *)pAVar7);
    pVVar4 = (Variable *)operator_new(0x28);
    ResourceDefinition::Variable::Variable(pVVar4,(SharedPtr *)&variable_17.m_state,TYPE_FLOAT_VEC4)
    ;
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               *)local_438,(Node *)pVVar4);
    pRVar5 = (ResourceTestCase *)operator_new(0xb0);
    ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
              (&local_440,PROGRAMINTERFACE_PROGRAM_INPUT,0x20);
    ResourceTestCase::ResourceTestCase
              (pRVar5,context,(SharedPtr *)local_438,&local_440,"patch_var_array_explicit_location")
    ;
    tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pRVar5);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                *)local_438);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                *)&variable_17.m_state);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                *)local_400);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                *)&arrayElem_4.m_state);
  }
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
              *)local_38);
  return;
}

Assistant:

static void generateProgramInputLocationBlockContents (Context& context, const ResourceDefinition::Node::SharedPtr& parentStructure, tcu::TestCaseGroup* targetGroup, deUint32 presentShadersMask)
{
	const bool									inDefaultBlock	= parentStructure->getType() == ResourceDefinition::Node::TYPE_DEFAULT_BLOCK;
	const ResourceDefinition::Node::SharedPtr	input			= (inDefaultBlock)
																	? (ResourceDefinition::Node::SharedPtr(new ResourceDefinition::StorageQualifier(parentStructure, glu::STORAGE_IN)))
																	: (parentStructure);
	const glu::ShaderType						firstStage		= getShaderMaskFirstStage(presentShadersMask);

	if (firstStage == glu::SHADERTYPE_VERTEX)
	{
		// .var
		{
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(input, glu::TYPE_FLOAT_VEC4));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_PROGRAM_INPUT, PROGRAMRESOURCEPROP_LOCATION), "var"));
		}
		// .var_explicit_location
		{
			const ResourceDefinition::Node::SharedPtr layout	(new ResourceDefinition::LayoutQualifier(input, glu::Layout(2)));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(layout, glu::TYPE_FLOAT_VEC4));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_PROGRAM_INPUT, PROGRAMRESOURCEPROP_LOCATION), "var_explicit_location"));
		}
	}
	else if (firstStage == glu::SHADERTYPE_FRAGMENT || !inDefaultBlock)
	{
		// .var
		{
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(input, glu::TYPE_FLOAT_VEC4));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_PROGRAM_INPUT, PROGRAMRESOURCEPROP_LOCATION), "var"));
		}
		// .var_explicit_location
		{
			const ResourceDefinition::Node::SharedPtr layout	(new ResourceDefinition::LayoutQualifier(input, glu::Layout(2)));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(layout, glu::TYPE_FLOAT_VEC4));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_PROGRAM_INPUT, PROGRAMRESOURCEPROP_LOCATION), "var_explicit_location"));
		}
		// .var_struct
		{
			const ResourceDefinition::Node::SharedPtr structMbr	(new ResourceDefinition::StructMember(input));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(structMbr, glu::TYPE_FLOAT_VEC4));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_PROGRAM_INPUT, PROGRAMRESOURCEPROP_LOCATION), "var_struct"));
		}
		// .var_struct_explicit_location
		{
			const ResourceDefinition::Node::SharedPtr layout	(new ResourceDefinition::LayoutQualifier(input, glu::Layout(2)));
			const ResourceDefinition::Node::SharedPtr structMbr	(new ResourceDefinition::StructMember(layout));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(structMbr, glu::TYPE_FLOAT_VEC4));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_PROGRAM_INPUT, PROGRAMRESOURCEPROP_LOCATION), "var_struct_explicit_location"));
		}
		// .var_array
		{
			const ResourceDefinition::Node::SharedPtr arrayElem	(new ResourceDefinition::ArrayElement(input));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(arrayElem, glu::TYPE_FLOAT_VEC4));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_PROGRAM_INPUT, PROGRAMRESOURCEPROP_LOCATION), "var_array"));
		}
		// .var_array_explicit_location
		{
			const ResourceDefinition::Node::SharedPtr layout	(new ResourceDefinition::LayoutQualifier(input, glu::Layout(2)));
			const ResourceDefinition::Node::SharedPtr arrayElem	(new ResourceDefinition::ArrayElement(layout));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(arrayElem, glu::TYPE_FLOAT_VEC4));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_PROGRAM_INPUT, PROGRAMRESOURCEPROP_LOCATION), "var_array_explicit_location"));
		}
	}
	else if (firstStage == glu::SHADERTYPE_TESSELLATION_CONTROL ||
			 firstStage == glu::SHADERTYPE_GEOMETRY)
	{
		// arrayed interface

		// .var
		{
			const ResourceDefinition::Node::SharedPtr arrayElem	(new ResourceDefinition::ArrayElement(input, ResourceDefinition::ArrayElement::UNSIZED_ARRAY));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(arrayElem, glu::TYPE_FLOAT_VEC4));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_PROGRAM_INPUT, PROGRAMRESOURCEPROP_LOCATION), "var"));
		}
		// .var_explicit_location
		{
			const ResourceDefinition::Node::SharedPtr layout	(new ResourceDefinition::LayoutQualifier(input, glu::Layout(2)));
			const ResourceDefinition::Node::SharedPtr arrayElem	(new ResourceDefinition::ArrayElement(layout, ResourceDefinition::ArrayElement::UNSIZED_ARRAY));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(arrayElem, glu::TYPE_FLOAT_VEC4));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_PROGRAM_INPUT, PROGRAMRESOURCEPROP_LOCATION), "var_explicit_location"));
		}
		// extension forbids use arrays of structs
		// extension forbids use arrays of arrays
	}
	else if (firstStage == glu::SHADERTYPE_TESSELLATION_EVALUATION)
	{
		// arrayed interface
		const ResourceDefinition::Node::SharedPtr patchInput(new ResourceDefinition::StorageQualifier(parentStructure, glu::STORAGE_PATCH_IN));

		// .var
		{
			const ResourceDefinition::Node::SharedPtr arrayElem	(new ResourceDefinition::ArrayElement(input, ResourceDefinition::ArrayElement::UNSIZED_ARRAY));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(arrayElem, glu::TYPE_FLOAT_VEC4));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_PROGRAM_INPUT, PROGRAMRESOURCEPROP_LOCATION), "var"));
		}
		// .var_explicit_location
		{
			const ResourceDefinition::Node::SharedPtr layout	(new ResourceDefinition::LayoutQualifier(input, glu::Layout(2)));
			const ResourceDefinition::Node::SharedPtr arrayElem	(new ResourceDefinition::ArrayElement(layout, ResourceDefinition::ArrayElement::UNSIZED_ARRAY));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(arrayElem, glu::TYPE_FLOAT_VEC4));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_PROGRAM_INPUT, PROGRAMRESOURCEPROP_LOCATION), "var_explicit_location"));
		}
		// extension forbids use arrays of structs
		// extension forbids use arrays of arrays

		// .patch_var
		{
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(patchInput, glu::TYPE_FLOAT_VEC4));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_PROGRAM_INPUT, PROGRAMRESOURCEPROP_LOCATION), "patch_var"));
		}
		// .patch_var_explicit_location
		{
			const ResourceDefinition::Node::SharedPtr layout	(new ResourceDefinition::LayoutQualifier(patchInput, glu::Layout(2)));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(layout, glu::TYPE_FLOAT_VEC4));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_PROGRAM_INPUT, PROGRAMRESOURCEPROP_LOCATION), "patch_var_explicit_location"));
		}
		// .patch_var_struct
		{
			const ResourceDefinition::Node::SharedPtr structMbr	(new ResourceDefinition::StructMember(patchInput));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(structMbr, glu::TYPE_FLOAT_VEC4));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_PROGRAM_INPUT, PROGRAMRESOURCEPROP_LOCATION), "patch_var_struct"));
		}
		// .patch_var_struct_explicit_location
		{
			const ResourceDefinition::Node::SharedPtr layout	(new ResourceDefinition::LayoutQualifier(patchInput, glu::Layout(2)));
			const ResourceDefinition::Node::SharedPtr structMbr	(new ResourceDefinition::StructMember(layout));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(structMbr, glu::TYPE_FLOAT_VEC4));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_PROGRAM_INPUT, PROGRAMRESOURCEPROP_LOCATION), "patch_var_struct_explicit_location"));
		}
		// .patch_var_array
		{
			const ResourceDefinition::Node::SharedPtr arrayElem	(new ResourceDefinition::ArrayElement(patchInput));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(arrayElem, glu::TYPE_FLOAT_VEC4));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_PROGRAM_INPUT, PROGRAMRESOURCEPROP_LOCATION), "patch_var_array"));
		}
		// .patch_var_array_explicit_location
		{
			const ResourceDefinition::Node::SharedPtr layout	(new ResourceDefinition::LayoutQualifier(patchInput, glu::Layout(2)));
			const ResourceDefinition::Node::SharedPtr arrayElem	(new ResourceDefinition::ArrayElement(layout));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(arrayElem, glu::TYPE_FLOAT_VEC4));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_PROGRAM_INPUT, PROGRAMRESOURCEPROP_LOCATION), "patch_var_array_explicit_location"));
		}
	}
	else if (firstStage == glu::SHADERTYPE_COMPUTE)
	{
		// nada
	}
	else
		DE_ASSERT(false);
}